

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::Border::Border(Border *this,Elements *children)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d [13];
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_30;
  Elements *local_18;
  Elements *children_local;
  Border *this_local;
  
  local_18 = children;
  children_local = (Elements *)this;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_30,children);
  Node::Node(&this->super_Node,&local_30);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_30);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Border_00219f30;
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector(&this->charset_pixel);
  __first = std::begin<std::__cxx11::string,10ul>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> (*) [10])
                       simple_border_charset_abi_cxx11_);
  __last = std::end<std::__cxx11::string,10ul>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> (*) [10])
                      simple_border_charset_abi_cxx11_);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_3d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->charset,
             __first,__last,local_3d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_3d);
  return;
}

Assistant:

Border(Elements children)
      : Node(std::move(children)),
        charset(std::begin(simple_border_charset),
                std::end(simple_border_charset)) {}